

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O2

int tnt_iter_array_next(tnt_iter *i)

{
  char *pcVar1;
  uint uVar2;
  
  uVar2 = (i->data).array.cur_index + 1;
  (i->data).array.cur_index = uVar2;
  if (uVar2 < (i->data).array.elem_count) {
    pcVar1 = *(char **)((long)&i->data + (ulong)(uVar2 != 0) * 0x10 + 8);
    (i->data).array.elem = pcVar1;
    (i->data).array.elem_end = pcVar1;
    mp_next(&(i->data).array.elem_end);
    return 1;
  }
  i->status = TNT_ITER_FAIL;
  return 0;
}

Assistant:

static int tnt_iter_array_next(struct tnt_iter *i) {
	struct tnt_iter_array *itr = TNT_IARRAY(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->elem_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->elem = itr->first_elem;
	else
		itr->elem = itr->elem_end;
	itr->elem_end = itr->elem;
	mp_next(&itr->elem_end);
	return 1;
}